

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

ssize_t Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<348U,_Fixpp::Type::Int>_>_>::write
                  (int __fd,void *__buf,size_t __n)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined4 in_register_0000003c;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  poVar1 = std::ostream::_M_insert<unsigned_long>(CONCAT44(in_register_0000003c,__fd));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=",1);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  uStack_28 = CONCAT17(0x7c,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  return CONCAT44(in_register_0000003c,__fd);
}

Assistant:

static std::ostream& write(std::ostream& os, const Field& field)
        {
            auto value = field.get();
            os << Field::Tag::Id << "=" << value << SOH;
            return os;
        }